

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int decompose_f5_ext_stem_d1
              (vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
              default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  int *piVar1;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int *stems;
  int ee;
  int e;
  sc_wrapper_f5 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int j_local;
  vrna_fold_compound_t *fc_local;
  
  piVar1 = get_stem_contributions_d0(fc,j,evaluate,hc_dat_local,sc_wrapper);
  local_44 = decompose_f5_ext_stem(fc,j,piVar1);
  if (piVar1[1] <= local_44) {
    local_44 = piVar1[1];
  }
  free(piVar1);
  if (local_44 < 0x989681) {
    local_48 = local_44;
  }
  else {
    local_48 = 10000000;
  }
  piVar1 = f5_get_stem_contributions_d5(fc,j,evaluate,hc_dat_local,sc_wrapper);
  local_4c = decompose_f5_ext_stem(fc,j,piVar1);
  if (piVar1[1] <= local_4c) {
    local_4c = piVar1[1];
  }
  free(piVar1);
  if (local_48 < local_4c) {
    local_50 = local_48;
  }
  else {
    local_50 = local_4c;
  }
  piVar1 = f5_get_stem_contributions_d3(fc,j,evaluate,hc_dat_local,sc_wrapper);
  local_54 = decompose_f5_ext_stem(fc,j,piVar1);
  if (piVar1[1] <= local_54) {
    local_54 = piVar1[1];
  }
  free(piVar1);
  if (local_50 < local_54) {
    local_58 = local_50;
  }
  else {
    local_58 = local_54;
  }
  piVar1 = f5_get_stem_contributions_d53(fc,j,evaluate,hc_dat_local,sc_wrapper);
  local_5c = decompose_f5_ext_stem(fc,j,piVar1);
  if (piVar1[1] <= local_5c) {
    local_5c = piVar1[1];
  }
  free(piVar1);
  if (local_58 < local_5c) {
    local_60 = local_58;
  }
  else {
    local_60 = local_5c;
  }
  return local_60;
}

Assistant:

int
decompose_f5_ext_stem_d1(vrna_fold_compound_t       *fc,
                         int                        j,
                         vrna_callback_hc_evaluate  *evaluate,
                         struct default_data        *hc_dat_local,
                         struct sc_wrapper_f5       *sc_wrapper)
{
  int e, ee, *stems;

  e = INF;

  /* A) without dangling end contributions */

  /* 1st case, actual decompostion */
  stems = get_stem_contributions_d0(fc, j, evaluate, hc_dat_local, sc_wrapper);

  ee = decompose_f5_ext_stem(fc, j, stems);

  /* 2nd case, reduce to single stem */
  ee = MIN2(ee, stems[1]);

  free(stems);

  e = MIN2(e, ee);

  /* B) with dangling end contribution on 5' side of stem */
  stems = f5_get_stem_contributions_d5(fc, j, evaluate, hc_dat_local, sc_wrapper);

  /* 1st case, actual decompostion */
  ee = decompose_f5_ext_stem(fc, j, stems);

  /* 2nd case, reduce to single stem */
  ee = MIN2(ee, stems[1]);

  free(stems);

  e = MIN2(e, ee);

  /* C) with dangling end contribution on 3' side of stem */
  stems = f5_get_stem_contributions_d3(fc, j, evaluate, hc_dat_local, sc_wrapper);

  /* 1st case, actual decompostion */
  ee = decompose_f5_ext_stem(fc, j, stems);

  /* 2nd case, reduce to single stem */
  ee = MIN2(ee, stems[1]);

  free(stems);

  e = MIN2(e, ee);

  /* D) with dangling end contribution on both sides of stem */
  stems = f5_get_stem_contributions_d53(fc, j, evaluate, hc_dat_local, sc_wrapper);

  /* 1st case, actual decompostion */
  ee = decompose_f5_ext_stem(fc, j, stems);

  /* 2nd case, reduce to single stem */
  ee = MIN2(ee, stems[1]);

  free(stems);

  e = MIN2(e, ee);

  return e;
}